

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keybdnu.c
# Opt level: O0

char * al_keycode_to_name(int keycode)

{
  int in_EDI;
  char *name;
  char *local_10;
  
  local_10 = (char *)0x0;
  if (new_keyboard_driver->keycode_to_name != (_func_char_ptr_int *)0x0) {
    local_10 = (*new_keyboard_driver->keycode_to_name)(in_EDI);
  }
  if (local_10 == (char *)0x0) {
    local_10 = _al_keyboard_common_names[in_EDI];
  }
  return local_10;
}

Assistant:

const char *al_keycode_to_name(int keycode)
{
   const char *name = NULL;

   ASSERT(new_keyboard_driver);
   ASSERT((keycode >= 0) && (keycode < ALLEGRO_KEY_MAX));

   if (new_keyboard_driver->keycode_to_name)
      name = new_keyboard_driver->keycode_to_name(keycode);

   if (!name)
      name = _al_keyboard_common_names[keycode];

   ASSERT(name);

   return name;
}